

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

void pair1_sock_send(void *arg,nni_aio *aio)

{
  pair1_pipe *p_00;
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  nni_msg *m_00;
  size_t sz;
  size_t sVar4;
  pair1_pipe *p;
  size_t len;
  nni_msg *m;
  pair1_sock *s;
  nni_aio *aio_local;
  void *arg_local;
  
  m_00 = nni_aio_get_msg(aio);
  sz = nni_msg_len(m_00);
  nni_sock_bump_tx(*arg,sz);
  if ((*(byte *)((long)arg + 0x330) & 1) == 0) {
    if ((*(byte *)((long)arg + 8) & 1) == 0) {
      nni_msg_header_clear(m_00);
      nni_msg_header_append_u32(m_00,0);
    }
    else {
      sVar4 = nni_msg_header_len(m_00);
      if ((sVar4 != 4) || (uVar2 = nni_msg_header_peek_u32(m_00), 0xfe < uVar2)) {
        nni_stat_inc((nni_stat_item *)((long)arg + 0x2b0),1);
        nni_aio_finish_error(aio,NNG_EPROTO);
        return;
      }
    }
  }
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  if ((*(byte *)((long)arg + 0x129) & 1) == 0) {
    iVar3 = nni_lmq_put((nni_lmq *)((long)arg + 0x48),m_00);
    if (iVar3 == 0) {
      nni_aio_set_msg(aio,(nni_msg *)0x0);
      nni_aio_finish(aio,NNG_OK,sz);
      _Var1 = nni_lmq_full((nni_lmq *)((long)arg + 0x48));
      if (_Var1) {
        nni_pollable_clear((nni_pollable *)((long)arg + 0x108));
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
    }
    else {
      _Var1 = nni_aio_start(aio,pair1_cancel,arg);
      if (_Var1) {
        nni_aio_list_append((nni_list *)((long)arg + 0x90),aio);
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
      }
      else {
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
      }
    }
  }
  else {
    p_00 = *(pair1_pipe **)((long)arg + 0x10);
    _Var1 = nni_lmq_full((nni_lmq *)((long)arg + 0x48));
    if (_Var1) {
      nni_pollable_clear((nni_pollable *)((long)arg + 0x108));
    }
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_aio_finish(aio,NNG_OK,sz);
    pair1_pipe_send(p_00,m_00);
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  }
  return;
}

Assistant:

static void
pair1_sock_send(void *arg, nni_aio *aio)
{
	pair1_sock *s = arg;
	nni_msg    *m;
	size_t      len;

	m   = nni_aio_get_msg(aio);
	len = nni_msg_len(m);
	nni_sock_bump_tx(s->sock, len);

#ifdef NNG_TEST_LIB
	if (s->inject_header) {
		goto inject;
	}
#endif

	// Raw mode messages have the header already formed, with a hop count.
	// Cooked mode messages have no header, so we have to add one.
	if (s->raw) {
		if ((nni_msg_header_len(m) != sizeof(uint32_t)) ||
		    (nni_msg_header_peek_u32(m) >= 0xff)) {
			BUMP_STAT(&s->stat_tx_malformed);
			nni_aio_finish_error(aio, NNG_EPROTO);
			return;
		}

	} else {
		// Strip off any previously existing header, such as when
		// replying to a message.
		nni_msg_header_clear(m);
		nni_msg_header_append_u32(m, 0);
	}

#ifdef NNG_TEST_LIB
inject:
#endif

	nni_mtx_lock(&s->mtx);
	if (s->wr_ready) {
		pair1_pipe *p = s->p;
		if (nni_lmq_full(&s->wmq)) {
			nni_pollable_clear(&s->writable);
		}
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		pair1_pipe_send(p, m);
		nni_mtx_unlock(&s->mtx);
		return;
	}

	// Can we queue it?
	if (nni_lmq_put(&s->wmq, m) == 0) {
		// Yay, we can.  So we're done.
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		if (nni_lmq_full(&s->wmq)) {
			nni_pollable_clear(&s->writable);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}

	if (!nni_aio_start(aio, pair1_cancel, s)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_aio_list_append(&s->waq, aio);
	nni_mtx_unlock(&s->mtx);
}